

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O0

int ffpcl(fitsfile *fptr,int datatype,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem
         ,void *array,int *status)

{
  int in_ESI;
  char *in_stack_00000140;
  long in_stack_00000148;
  long in_stack_00000150;
  LONGLONG in_stack_00000158;
  int in_stack_00000164;
  fitsfile *in_stack_00000168;
  char *in_stack_00000180;
  LONGLONG in_stack_00000188;
  LONGLONG in_stack_00000190;
  LONGLONG in_stack_00000198;
  int in_stack_000001a4;
  fitsfile *in_stack_000001a8;
  int *in_stack_000001b0;
  int *in_stack_000001f0;
  double *in_stack_00007250;
  LONGLONG in_stack_00007258;
  uchar *in_stack_00007260;
  LONGLONG in_stack_00007268;
  undefined4 in_stack_00007270;
  int in_stack_00007274;
  fitsfile *in_stack_00007278;
  undefined4 in_stack_00007280;
  int in_stack_00007284;
  fitsfile *in_stack_00007288;
  LONGLONG in_stack_00007290;
  LONGLONG in_stack_00007298;
  int in_stack_000072a4;
  fitsfile *in_stack_000072a8;
  int *in_stack_000072c0;
  int *in_stack_000072d0;
  int *in_stack_000072f0;
  undefined4 local_4;
  
  if (*(int *)firstelem < 1) {
    if (in_ESI == 1) {
      ffpclx(in_stack_00000168,in_stack_00000164,in_stack_00000158,in_stack_00000150,
             in_stack_00000148,in_stack_00000140,in_stack_000001b0);
    }
    else if (in_ESI == 0xb) {
      ffpclb(in_stack_00007288,in_stack_00007284,(LONGLONG)in_stack_00007278,
             CONCAT44(in_stack_00007274,in_stack_00007270),in_stack_00007268,in_stack_00007260,
             in_stack_000072d0);
    }
    else if (in_ESI == 0xc) {
      ffpclsb(in_stack_00007278,in_stack_00007274,in_stack_00007268,(LONGLONG)in_stack_00007260,
              in_stack_00007258,(char *)in_stack_00007250,in_stack_000072c0);
    }
    else if (in_ESI == 0x14) {
      ffpclui(in_stack_00007278,in_stack_00007274,in_stack_00007268,(LONGLONG)in_stack_00007260,
              in_stack_00007258,(unsigned_short *)in_stack_00007250,in_stack_000072c0);
    }
    else if (in_ESI == 0x15) {
      ffpcli(in_stack_00007278,in_stack_00007274,in_stack_00007268,(LONGLONG)in_stack_00007260,
             in_stack_00007258,(short *)in_stack_00007250,in_stack_000072c0);
    }
    else if (in_ESI == 0x1e) {
      ffpcluk(in_stack_00007278,in_stack_00007274,in_stack_00007268,(LONGLONG)in_stack_00007260,
              in_stack_00007258,(uint *)in_stack_00007250,in_stack_000072c0);
    }
    else if (in_ESI == 0x1f) {
      ffpclk(in_stack_00007278,in_stack_00007274,in_stack_00007268,(LONGLONG)in_stack_00007260,
             in_stack_00007258,(int *)in_stack_00007250,in_stack_000072c0);
    }
    else if (in_ESI == 0x28) {
      ffpcluj(in_stack_00007278,in_stack_00007274,in_stack_00007268,(LONGLONG)in_stack_00007260,
              in_stack_00007258,(unsigned_long *)in_stack_00007250,in_stack_000072c0);
    }
    else if (in_ESI == 0x29) {
      ffpclj(in_stack_00007278,in_stack_00007274,in_stack_00007268,(LONGLONG)in_stack_00007260,
             in_stack_00007258,(long *)in_stack_00007250,in_stack_000072c0);
    }
    else if (in_ESI == 0x50) {
      ffpclujj(in_stack_00007278,in_stack_00007274,in_stack_00007268,(LONGLONG)in_stack_00007260,
               in_stack_00007258,(ULONGLONG *)in_stack_00007250,in_stack_000072c0);
    }
    else if (in_ESI == 0x51) {
      ffpcljj(in_stack_00007278,in_stack_00007274,in_stack_00007268,(LONGLONG)in_stack_00007260,
              in_stack_00007258,(LONGLONG *)in_stack_00007250,in_stack_000072c0);
    }
    else if (in_ESI == 0x2a) {
      ffpcle(in_stack_00007278,in_stack_00007274,in_stack_00007268,(LONGLONG)in_stack_00007260,
             in_stack_00007258,(float *)in_stack_00007250,in_stack_000072c0);
    }
    else if (in_ESI == 0x52) {
      ffpcld(in_stack_00007278,in_stack_00007274,in_stack_00007268,(LONGLONG)in_stack_00007260,
             in_stack_00007258,in_stack_00007250,in_stack_000072c0);
    }
    else if (in_ESI == 0x53) {
      ffpcle(in_stack_00007278,in_stack_00007274,in_stack_00007268,(LONGLONG)in_stack_00007260,
             in_stack_00007258,(float *)in_stack_00007250,in_stack_000072c0);
    }
    else if (in_ESI == 0xa3) {
      ffpcld(in_stack_00007278,in_stack_00007274,in_stack_00007268,(LONGLONG)in_stack_00007260,
             in_stack_00007258,in_stack_00007250,in_stack_000072c0);
    }
    else if (in_ESI == 0xe) {
      ffpcll(in_stack_000001a8,in_stack_000001a4,in_stack_00000198,in_stack_00000190,
             in_stack_00000188,in_stack_00000180,in_stack_000001f0);
    }
    else if (in_ESI == 0x10) {
      ffpcls(in_stack_000072a8,in_stack_000072a4,in_stack_00007298,in_stack_00007290,
             (LONGLONG)in_stack_00007288,(char **)CONCAT44(in_stack_00007284,in_stack_00007280),
             in_stack_000072f0);
    }
    else {
      *(undefined4 *)firstelem = 0x19a;
    }
    local_4 = *(int *)firstelem;
  }
  else {
    local_4 = *(int *)firstelem;
  }
  return local_4;
}

Assistant:

int ffpcl(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int  datatype,   /* I - datatype of the value                   */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of elements to write             */
            void  *array,    /* I - array of values that are written        */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to a table column.  The datatype of the
  input array is defined by the 2nd argument. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS column is not the same as the array being written).

*/
{
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TBIT)
    {
      ffpclx(fptr, colnum, firstrow, (long) firstelem, (long) nelem, (char *) array, 
             status);
    }
    else if (datatype == TBYTE)
    {
      ffpclb(fptr, colnum, firstrow, firstelem, nelem, (unsigned char *) array,
             status);
    }
    else if (datatype == TSBYTE)
    {
      ffpclsb(fptr, colnum, firstrow, firstelem, nelem, (signed char *) array,
             status);
    }
    else if (datatype == TUSHORT)
    {
      ffpclui(fptr, colnum, firstrow, firstelem, nelem, 
             (unsigned short *) array, status);
    }
    else if (datatype == TSHORT)
    {
      ffpcli(fptr, colnum, firstrow, firstelem, nelem, (short *) array,
             status);
    }
    else if (datatype == TUINT)
    {
      ffpcluk(fptr, colnum, firstrow, firstelem, nelem, (unsigned int *) array,
               status);
    }
    else if (datatype == TINT)
    {
      ffpclk(fptr, colnum, firstrow, firstelem, nelem, (int *) array,
               status);
    }
    else if (datatype == TULONG)
    {
      ffpcluj(fptr, colnum, firstrow, firstelem, nelem, (unsigned long *) array,
              status);
    }
    else if (datatype == TLONG)
    {
      ffpclj(fptr, colnum, firstrow, firstelem, nelem, (long *) array,
             status);
    }
    else if (datatype == TULONGLONG)
    {
      ffpclujj(fptr, colnum, firstrow, firstelem, nelem, (ULONGLONG *) array,
             status);
    }
    else if (datatype == TLONGLONG)
    {
      ffpcljj(fptr, colnum, firstrow, firstelem, nelem, (LONGLONG *) array,
             status);
    }
    else if (datatype == TFLOAT)
    {
      ffpcle(fptr, colnum, firstrow, firstelem, nelem, (float *) array,
             status);
    }
    else if (datatype == TDOUBLE)
    {
      ffpcld(fptr, colnum, firstrow, firstelem, nelem, (double *) array,
             status);
    }
    else if (datatype == TCOMPLEX)
    {
      ffpcle(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
             (float *) array, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
      ffpcld(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
             (double *) array, status);
    }
    else if (datatype == TLOGICAL)
    {
      ffpcll(fptr, colnum, firstrow, firstelem, nelem, (char *) array,
             status);
    }
    else if (datatype == TSTRING)
    {
      ffpcls(fptr, colnum, firstrow, firstelem, nelem, (char **) array,
             status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}